

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

bool_t Node_Notify(node *Node,dataid Id)

{
  nodedata *pnVar1;
  nodedata *pnVar2;
  nodedata *pnVar3;
  undefined8 *puVar4;
  nodecontext *p;
  nodedata *pnVar5;
  nodedata *pnVar6;
  bool bVar7;
  bool bVar8;
  bool_t bVar9;
  nodedata *pnVar10;
  nodedata **local_78;
  node *local_40;
  dataid local_38;
  
  local_78 = Node_GetDataStart(Node,Id,0xe);
  if (local_78 == (nodedata **)0x0) {
    bVar9 = 0;
  }
  else {
    if (Node == (node *)0x0) {
      __assert_fail("(const void*)(Node)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x6f3,"bool_t Node_Notify(node *, dataid)");
    }
    pnVar3 = *local_78;
    if (pnVar3[1].Code == 0) {
      puVar4 = (undefined8 *)Node->VMT;
      p = (nodecontext *)*puVar4;
      pnVar1 = pnVar3 + 1;
      pnVar3[1].Code = (size_t)pnVar1;
      local_40 = Node;
      local_38 = Id;
      if (pnVar3[1].Next == (nodedata *)0x0) {
        __assert_fail("n!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x6c6,"void Node_NotifyInternal(node *, dataid, nodedata **, nodecontext *)")
        ;
      }
      pnVar2 = pnVar3 + 2;
      bVar8 = false;
      bVar7 = false;
      pnVar10 = pnVar3[1].Next;
      do {
        pnVar2->Next = pnVar10;
        (*(code *)pnVar10->Code)(pnVar10[1].Next,&local_40);
        pnVar5 = pnVar10->Next;
        pnVar6 = pnVar2->Next;
        if (pnVar6 == pnVar2) {
          bVar7 = true;
        }
        else if (pnVar6 == pnVar1) {
          bVar8 = true;
        }
        else if (pnVar6 == (nodedata *)0x0) {
          (*p->NodeHeap->Free)(p->NodeHeap,pnVar10,0x18);
          local_78 = Node_GetDataStart(Node,Id,0xe);
        }
        pnVar10 = pnVar5;
      } while (pnVar5 != (nodedata *)0x0);
      pnVar3[2].Next = (nodedata *)0x0;
      if (bVar7) {
        DataFree(p,Node,local_78,1);
        EraseNode(p,Node,(nodeclass *)(puVar4 + -9));
      }
      else if ((Id == 0xb) || (bVar8 || pnVar1->Next == (nodedata *)0x0)) {
        DataFree(p,Node,local_78,0);
      }
      pnVar3[1].Code = 0;
    }
    bVar9 = 1;
  }
  return bVar9;
}

Assistant:

bool_t Node_Notify(node* Node,dataid Id)
{
    nodedata** i = Node_GetDataStart(Node,Id,TYPE_NODENOTIFY);
    if (i && NodeData_Data(*i))
    {
        Node_NotifyInternal(Node,Id,i,Node_Context(Node));
        return 1;
    }
    return 0;
}